

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t * gs_eval_stmt_var_decl(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_stmt_t *stmt)

{
  gs_expr_t **ppgVar1;
  undefined8 uVar2;
  map_node_t **ppmVar3;
  gs_val_t *val;
  anon_union_16_10_4eabebd3_for_gs_val_2 local_78;
  map_base_t *local_68;
  gs_env_t *env;
  gs_token_t token;
  vec2 local_40;
  undefined8 local_38;
  gs_val_t local_30;
  gs_stmt_t *local_18;
  gs_stmt_t *stmt_local;
  gs_eval_t *eval_local;
  
  local_18 = stmt;
  stmt_local = (gs_stmt_t *)eval;
  gs_val_default(__return_storage_ptr__,(stmt->field_1).for_stmt.decl_type);
  if ((__return_storage_ptr__->is_return & 1U) != 0) {
    return __return_storage_ptr__;
  }
  if ((local_18->field_1).if_stmt.stmts != (gs_stmt_t **)0x0) {
    gs_eval_expr(&local_30,(gs_eval_t *)stmt_local,(local_18->field_1).var_decl.init);
    __return_storage_ptr__->type = local_30.type;
    __return_storage_ptr__->is_return = local_30.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_30._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_30.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_30.field_2._8_8_;
    if ((__return_storage_ptr__->is_return & 1U) != 0) {
      return __return_storage_ptr__;
    }
    gs_eval_cast((gs_val_t *)&token.field_3,(gs_eval_t *)stmt_local,*__return_storage_ptr__,
                 (local_18->field_1).for_stmt.decl_type);
    *(anon_union_8_5_f029217d_for_gs_token_3 *)__return_storage_ptr__ = token.field_3;
    (__return_storage_ptr__->field_2).vec2_val = local_40;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38;
    if ((__return_storage_ptr__->is_return & 1U) != 0) {
      return __return_storage_ptr__;
    }
  }
  if ((local_18->field_1).var_decl.num_ids == 1) {
    ppgVar1 = (local_18->field_1).if_stmt.conds;
    env = (gs_env_t *)*ppgVar1;
    token._0_8_ = ppgVar1[1];
    token._8_8_ = ppgVar1[2];
    local_68 = *(map_base_t **)
                (&((stmt_local->field_1).for_stmt.cond)->type +
                (long)(*(int *)((long)&stmt_local->field_1 + 0x30) + -1) * 2);
    ppmVar3 = (map_node_t **)map_get_(local_68,(char *)token._8_8_);
    local_68[1].buckets = ppmVar3;
    if (ppmVar3 == (map_node_t **)0x0) {
      uVar2._0_4_ = __return_storage_ptr__->type;
      uVar2._4_1_ = __return_storage_ptr__->is_return;
      uVar2._5_3_ = *(undefined3 *)&__return_storage_ptr__->field_0x5;
      local_68[1].nbuckets = (undefined4)uVar2;
      local_68[1].nnodes = (int)((ulong)uVar2 >> 0x20);
      local_68[2].buckets = (map_node_t **)(__return_storage_ptr__->field_2).vec2_val;
      uVar2 = *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8);
      local_68[2].nbuckets = (int)uVar2;
      local_68[2].nnodes = (int)((ulong)uVar2 >> 0x20);
      map_set_(local_68,(char *)token._8_8_,&local_68[1].nbuckets,0x18,(char *)local_68[3].buckets);
    }
    else {
      gs_val_error((gs_val_t *)&val,"Variable is already declared");
      *(gs_val_t **)__return_storage_ptr__ = val;
      (__return_storage_ptr__->field_2).vec2_val = local_78.vec2_val;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78._8_8_;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("stmt->var_decl.num_ids == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                ,0x3a3,"gs_val_t gs_eval_stmt_var_decl(gs_eval_t *, gs_stmt_t *)");
}

Assistant:

static gs_val_t gs_eval_stmt_var_decl(gs_eval_t *eval, gs_stmt_t *stmt) {
    gs_val_t val = gs_val_default(stmt->var_decl.type);
    if (val.is_return) goto cleanup;

    if (stmt->var_decl.init) {
        val = gs_eval_expr(eval, stmt->var_decl.init);
        if (val.is_return) goto cleanup;

        val = gs_eval_cast(eval, val, stmt->var_decl.type);
        if (val.is_return) goto cleanup;
    }

    assert(stmt->var_decl.num_ids == 1);

    gs_token_t token = stmt->var_decl.tokens[0];
    gs_env_t *env = vec_last(&eval->env);
    if (map_get(&env->val_map, token.symbol)) {
        val = gs_val_error("Variable is already declared");
        goto cleanup;
    }
    map_set(&env->val_map, token.symbol, val);

cleanup:
    return val;
}